

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  bool bVar1;
  IMutableContext *pIVar2;
  Config *pCVar3;
  ostream *poVar4;
  Column *col;
  string local_128;
  Column local_108;
  Colour local_cd [13];
  Args local_c0;
  undefined1 local_88 [8];
  InternalParseResult result;
  char **argv_local;
  int argc_local;
  Session *this_local;
  
  if ((this->m_startupExceptions & 1U) == 0) {
    result.m_errorMessage.field_2._8_8_ = argv;
    Clara::Args::Args(&local_c0,argc,argv);
    Clara::Detail::ParserBase::parse((InternalParseResult *)local_88,(ParserBase *)this,&local_c0);
    Clara::Args::~Args(&local_c0);
    bVar1 = Clara::Detail::BasicResult::operator_cast_to_bool((BasicResult *)local_88);
    if (bVar1) {
      if (((this->m_configData).showHelp & 1U) != 0) {
        showHelp(this);
      }
      if (((this->m_configData).libIdentify & 1U) != 0) {
        libIdentify(this);
      }
      Detail::unique_ptr<Catch::Config>::reset(&this->m_config,(Config *)0x0);
      this_local._4_4_ = 0;
    }
    else {
      config(this);
      pIVar2 = getCurrentMutableContext();
      pCVar3 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
      (*(pIVar2->super_IContext)._vptr_IContext[7])(pIVar2,pCVar3);
      poVar4 = cerr();
      Colour::Colour(local_cd,Red);
      poVar4 = Catch::operator<<(poVar4,local_cd);
      poVar4 = std::operator<<(poVar4,"\nError(s) in input:\n");
      Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::errorMessage_abi_cxx11_
                (&local_128,(BasicResult<Catch::Clara::Detail::ParseState> *)local_88);
      TextFlow::Column::Column(&local_108,&local_128);
      col = TextFlow::Column::indent(&local_108,2);
      poVar4 = TextFlow::operator<<(poVar4,col);
      std::operator<<(poVar4,"\n\n");
      TextFlow::Column::~Column(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      Colour::~Colour(local_cd);
      poVar4 = cerr();
      poVar4 = std::operator<<(poVar4,"Run with -? for usage\n");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0xff;
    }
    Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult
              ((BasicResult<Catch::Clara::Detail::ParseState> *)local_88);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Session::applyCommandLine(int argc, char const *const *argv) {
        if (m_startupExceptions)
            return 1;

        auto result = m_cli.parse(Clara::Args(argc, argv));
        if (!result) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            Catch::cerr()
                << Colour(Colour::Red)
                << "\nError(s) in input:\n"
                << TextFlow::Column(result.errorMessage()).indent(2)
                << "\n\n";
            Catch::cerr() << "Run with -? for usage\n" << std::endl;
            return MaxExitCode;
        }

        if (m_configData.showHelp)
            showHelp();
        if (m_configData.libIdentify)
            libIdentify();
        m_config.reset();
        return 0;
    }